

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarWithIntRangesType<yactfr::VariantWithUnsignedIntegerSelectorType,unsigned_long_long>
          (DtFromPseudoRootDtConverter *this,PseudoVarWithIntRangesType *pseudoVarType,
          DataLocation *selLoc)

{
  bool bVar1;
  ulong uVar2;
  PseudoNamedDts *pPVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  RangeSets *this_00;
  const_reference this_01;
  unsigned_long_long lower;
  unsigned_long_long upper;
  pointer pPVar6;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args_1
  ;
  pointer in_RCX;
  pair<std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_true>_>,_bool> pVar7;
  undefined1 local_170 [16];
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  local_160;
  key_type local_158;
  undefined1 local_150 [56];
  IntegerRangeSet<unsigned_long_long,_true> local_118;
  undefined1 local_e8 [8];
  undefined1 local_e0 [40];
  IntegerRange<unsigned_long_long,_false> *local_b8;
  IntegerRange<unsigned_long_long,_false> *range;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  ranges;
  value_type *pseudoOpt;
  key_type local_50;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  Options opts;
  DataLocation *selLoc_local;
  PseudoVarWithIntRangesType *pseudoVarType_local;
  DtFromPseudoRootDtConverter *this_local;
  
  opts.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RCX;
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
            *)local_40);
  local_44 = 0;
  while( true ) {
    uVar2 = (ulong)local_44;
    pPVar3 = PseudoVarType::pseudoOpts((PseudoVarType *)selLoc);
    sVar4 = std::
            vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
            ::size(pPVar3);
    if (sVar4 <= uVar2) break;
    uVar2 = (ulong)local_44;
    local_50 = (key_type)selLoc;
    pmVar5 = std::
             unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
             ::operator[]((unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
                           *)&(pseudoVarType->super_PseudoVarType).super_PseudoDt._posInScope.
                              super_type.m_storage,&local_50);
    *pmVar5 = uVar2;
    pPVar3 = PseudoVarType::pseudoOpts((PseudoVarType *)selLoc);
    ranges._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
                 ::operator[](pPVar3,(ulong)local_44);
    std::
    set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::set((set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
           *)&__range3);
    this_00 = PseudoVarWithIntRangesType::rangeSets((PseudoVarWithIntRangesType *)selLoc);
    this_01 = std::
              vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
              ::operator[](this_00,(ulong)local_44);
    __end3 = IntegerRangeSet<unsigned_long_long,_false>::begin(this_01);
    range = (IntegerRange<unsigned_long_long,_false> *)
            IntegerRangeSet<unsigned_long_long,_false>::end(this_01);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&range);
      if (!bVar1) break;
      local_b8 = std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_false>_>::
                 operator*(&__end3);
      lower = IntegerRange<unsigned_long_long,_false>::lower(local_b8);
      upper = IntegerRange<unsigned_long_long,_false>::upper(local_b8);
      IntegerRange<unsigned_long_long,_true>::IntegerRange
                ((IntegerRange<unsigned_long_long,_true> *)(local_e0 + 0x18),lower,upper);
      pVar7 = std::
              set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
              ::insert((set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                        *)&__range3,(value_type *)(local_e0 + 0x18));
      local_e0._8_8_ = pVar7.first._M_node;
      local_e0[0x10] = pVar7.second;
      std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_false>_>::operator++
                (&__end3);
    }
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)ranges._M_t._M_impl.super__Rb_tree_header._M_node_count);
    args_1 = PseudoNamedDt::name_abi_cxx11_(pPVar6);
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)ranges._M_t._M_impl.super__Rb_tree_header._M_node_count);
    PseudoNamedDt::pseudoDt(pPVar6);
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_e8,(PseudoDt *)pseudoVarType);
    std::
    set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::set((set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
           *)(local_150 + 8),
          (set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
           *)&__range3);
    IntegerRangeSet<unsigned_long_long,_true>::IntegerRangeSet
              (&local_118,
               (set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                *)(local_150 + 8));
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)ranges._M_t._M_impl.super__Rb_tree_header._M_node_count);
    WithAttrsMixin::attrs(&pPVar6->super_WithAttrsMixin);
    _tryCloneAttrs((MapItem *)local_150);
    VariantTypeOption<unsigned_long_long>::
    create<boost::optional<std::__cxx11::string>const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e0,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               args_1,(IntegerRangeSet<unsigned_long_long,_true> *)local_e8,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_118);
    std::
    vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
    ::push_back((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                 *)local_40,(value_type *)local_e0);
    std::
    unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
    ::~unique_ptr((unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                   *)local_e0);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_150);
    IntegerRangeSet<unsigned_long_long,_true>::~IntegerRangeSet(&local_118);
    std::
    set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~set((set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
            *)(local_150 + 8));
    std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
                local_e8);
    std::
    set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~set((set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
            *)&__range3);
    local_44 = local_44 + 1;
  }
  local_158 = (key_type)selLoc;
  std::
  unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
  ::erase((unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
           *)&(pseudoVarType->super_PseudoVarType).super_PseudoDt._posInScope.super_type.m_storage,
          &local_158);
  local_170._12_4_ = 1;
  WithAttrsMixin::attrs
            ((WithAttrsMixin *)
             &selLoc[1]._pathElems.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  _tryCloneAttrs((MapItem *)local_170);
  VariantWithUnsignedIntegerSelectorType::
  create<int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((int *)&local_160,
             (vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
              *)(local_170 + 0xc),(DataLocation *)local_40,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             opts.
             super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::VariantWithUnsignedIntegerSelectorType_const,std::default_delete<yactfr::VariantWithUnsignedIntegerSelectorType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             &local_160);
  std::
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  ::~unique_ptr(&local_160);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_170);
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::~vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             *)local_40);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarWithIntRangesType(const PseudoVarWithIntRangesType& pseudoVarType,
                                                                            DataLocation&& selLoc)
{
    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];
        std::set<IntegerRange<IntRangeValueT>> ranges;

        for (auto& range : pseudoVarType.rangeSets()[i]) {
            ranges.insert(IntegerRange<IntRangeValueT> {
                static_cast<IntRangeValueT>(range.lower()),
                static_cast<IntRangeValueT>(range.upper())
            });
        }

        opts.push_back(VarTypeT::Option::create(pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                IntegerRangeSet<IntRangeValueT> {std::move(ranges)},
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), std::move(selLoc),
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}